

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O0

string * __thiscall pbrt::GoniometricLight::ToString_abi_cxx11_(GoniometricLight *this)

{
  string *in_RDI;
  LightBase *in_stack_ffffffffffffff98;
  float *in_stack_ffffffffffffffc0;
  DenselySampledSpectrum *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  
  LightBase::BaseToString_abi_cxx11_(in_stack_ffffffffffffff98);
  StringPrintf<std::__cxx11::string,pbrt::DenselySampledSpectrum_const&,float_const&>
            (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
             in_stack_ffffffffffffffc0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  return in_RDI;
}

Assistant:

std::string GoniometricLight::ToString() const {
    return StringPrintf("[ GoniometricLight %s I: %s scale: %f ]", BaseToString(), I,
                        scale);
}